

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O0

void __thiscall OpenMD::LangevinPiston::LangevinPiston(LangevinPiston *this,SimInfo *info)

{
  bool bVar1;
  int iVar2;
  undefined8 *in_RDI;
  RealType stdDev;
  SimInfo *in_stack_000000c8;
  NPT *in_stack_000000d0;
  SimInfo *in_stack_ffffffffffffff78;
  shared_ptr<OpenMD::Utils::RandNumGen> *__r;
  LangevinPiston *in_stack_ffffffffffffff80;
  errorStruct *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  undefined8 local_58;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 uStack_48;
  undefined8 uStack_47;
  shared_ptr<OpenMD::Utils::RandNumGen> local_30 [3];
  
  NPT::NPT(in_stack_000000d0,in_stack_000000c8);
  *in_RDI = &PTR__LangevinPiston_00503598;
  std::shared_ptr<OpenMD::Utils::RandNumGen>::shared_ptr
            ((shared_ptr<OpenMD::Utils::RandNumGen> *)0x3d028b);
  std::normal_distribution<double>::normal_distribution((normal_distribution<double> *)0x3d029c);
  iVar2 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)in_RDI[0xe]);
  in_RDI[0x1f] = (double)iVar2 * 8.31451e-07 * (double)in_RDI[0x26];
  in_RDI[0x4b] = (double)in_RDI[0x1f] * (double)in_RDI[0x22];
  bVar1 = Globals::haveLangevinPistonDrag((Globals *)0x3d0304);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
  if (bVar1) {
    in_stack_ffffffffffffff80 =
         (LangevinPiston *)Globals::getLangevinPistonDrag((Globals *)0x3d038a);
    in_RDI[0x4c] = in_stack_ffffffffffffff80;
  }
  else {
    in_stack_ffffffffffffff88 = &painCave;
    snprintf(painCave.errMsg,2000,
             "To use the LangevinPiston integrator, you must set langevinPistonDrag (fs^-1).\n");
    in_stack_ffffffffffffff88->severity = 1;
    in_stack_ffffffffffffff88->isFatal = 1;
    simError();
  }
  SimInfo::getRandomNumberGenerator(in_stack_ffffffffffffff78);
  __r = local_30;
  std::shared_ptr<OpenMD::Utils::RandNumGen>::operator=
            ((shared_ptr<OpenMD::Utils::RandNumGen> *)in_stack_ffffffffffffff80,__r);
  std::shared_ptr<OpenMD::Utils::RandNumGen>::~shared_ptr
            ((shared_ptr<OpenMD::Utils::RandNumGen> *)0x3d03d9);
  sqrt((((double)in_RDI[0x4b] + (double)in_RDI[0x4b]) * (double)in_RDI[0x4c] * 8.31451e-07 *
       (double)in_RDI[0x26]) / (double)in_RDI[1]);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)CONCAT44(iVar2,uVar3),
             (result_type_conflict)in_stack_ffffffffffffff88,
             (result_type_conflict)in_stack_ffffffffffffff80);
  *(ulong *)((long)in_RDI + 0x241) = CONCAT17(uStack_48,uStack_4f);
  *(undefined8 *)((long)in_RDI + 0x249) = uStack_47;
  in_RDI[0x47] = local_58;
  in_RDI[0x48] = CONCAT71(uStack_4f,uStack_50);
  genRandomForce(in_stack_ffffffffffffff80,(RealType *)__r);
  return;
}

Assistant:

LangevinPiston::LangevinPiston(SimInfo* info) : NPT(info) {
    // NkBT has units of amu Ang^2 fs^-2 :
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // W_ has units of amu Ang^2
    // W_ = 3.0 * NkBT * tb2;
    W_ = NkBT * tb2;  // our eta scales all three box directions

    // gamma_ has units of fs^-1
    if (!simParams->haveLangevinPistonDrag()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "To use the LangevinPiston integrator, you must "
               "set langevinPistonDrag "
               "(fs^-1).\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      gamma_ = simParams->getLangevinPistonDrag();
    }

#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      randNumGen_ = info->getRandomNumberGenerator();

      // standard deviation units: amu Angs^2 fs^-2
      RealType stdDev =
          std::sqrt(2.0 * W_ * gamma_ * Constants::kB * targetTemp / dt);

      forceDistribution_ = std::normal_distribution<RealType>(0.0, stdDev);
#ifdef IS_MPI
    }
#endif

    // randomForce will have units amu Ang^2 fs^-2:
    genRandomForce(randomForce_);
  }

  void LangevinPiston::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += dt2 * Constants::energyConvert * Tb;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve eta a half step

    evolveEtaA();
    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    saveEta();
  }

  void LangevinPiston::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    instaVol = thermo.getVolume();

    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb;

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();
      if (this->etaConverged()) break;
    }

    flucQ_->moveB();
    saveEta();
  }

  void LangevinPiston::evolveEtaA() {
    // volume is Angs^3
    // pressures are in atm
    // pressureConvert takes amu*fs^-2*Ang^-1 -> atm
    eta += dt2 * (instaVol * (instaPress - targetPressure) /
                      (Constants::pressureConvert * W_) -
                  gamma_ * eta + randomForce_ / W_);
    oldEta = eta;
  }

  void LangevinPiston::evolveEtaB() {
    prevEta = eta;

    genRandomForce(randomForce_);

    eta = oldEta + dt2 * (instaVol * (instaPress - targetPressure) /
                              (Constants::pressureConvert * W_) -
                          gamma_ * eta + randomForce_ / W_);
  }

  void LangevinPiston::calcVelScale() { vScale = eta; }

  void LangevinPiston::getVelScaleA(Vector3d& sc, const Vector3d& vel) {
    sc = vScale * vel;
  }

  void LangevinPiston::getVelScaleB(Vector3d& sc, int index) {
    sc = vScale * oldVel[index];
  }

  void LangevinPiston::getPosScale(const Vector3d& pos, const Vector3d& COM,
                                   int index, Vector3d& sc) {
    Vector3d rj = (oldPos[index] + pos) / (RealType)2.0 - COM;
    sc          = eta * rj;
  }

  void LangevinPiston::scaleSimBox() {
    RealType scaleFactor;

    // This is from solving the first order equation that defines eta
    scaleFactor = exp(dt * eta);

    if ((scaleFactor > 1.1) || (scaleFactor < 0.9)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LangevinPiston error: Attempting a Box scaling of more than 10 "
               "percent\n"
               " check your tauBarostat, as it is probably too small!\n"
               " eta = %lf, scaleFactor = %lf\n",
               eta, scaleFactor);
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat *= scaleFactor;
      snap->setHmat(hmat);
    }
  }

  bool LangevinPiston::etaConverged() {
    return (fabs(prevEta - eta) <= etaTolerance);
  }

  void LangevinPiston::loadEta() {
    Mat3x3d etaMat = snap->getBarostat();
    eta            = etaMat(0, 0);
  }

  void LangevinPiston::saveEta() {
    Mat3x3d etaMat(0.0);
    etaMat(0, 0) = eta;
    etaMat(1, 1) = eta;
    etaMat(2, 2) = eta;
    snap->setBarostat(etaMat);
  }

  void LangevinPiston::genRandomForce(RealType& randomForce) {
#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      randomForce = forceDistribution_(*randNumGen_);
#ifdef IS_MPI
    }
    // push this out to the other processors
    // Same command on all nodes:
    MPI_Bcast(&randomForce, 1, MPI_REALTYPE, 0, MPI_COMM_WORLD);
#endif

    return;
  }
}